

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O1

TrackData * Generate11SectorTrack(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  Sector *pSVar1;
  bool bVar2;
  BitBuffer *bitstream;
  Sector *sector;
  Sector *sector_00;
  BitstreamTrackBuilder bitbuf;
  BitstreamTrackBuilder BStack_a8;
  
  bVar2 = Is11SectorTrack(track);
  if (bVar2) {
    BitstreamTrackBuilder::BitstreamTrackBuilder(&BStack_a8,_250K,MFM);
    TrackBuilder::addTrackStart(&BStack_a8.super_TrackBuilder,true);
    pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (sector_00 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                     super__Vector_impl_data._M_start; sector_00 != pSVar1;
        sector_00 = sector_00 + 1) {
      TrackBuilder::addSector(&BStack_a8.super_TrackBuilder,sector_00,1);
    }
    bitstream = BitstreamTrackBuilder::buffer(&BStack_a8);
    TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
    if (BStack_a8.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(BStack_a8.m_buffer.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)BStack_a8.m_buffer.m_sync_losses.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)BStack_a8.m_buffer.m_sync_losses.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (BStack_a8.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(BStack_a8.m_buffer.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)BStack_a8.m_buffer.m_indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)BStack_a8.m_buffer.m_indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (BStack_a8.m_buffer.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(BStack_a8.m_buffer.m_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)BStack_a8.m_buffer.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)BStack_a8.m_buffer.m_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("Is11SectorTrack(track)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                ,0x310,"TrackData Generate11SectorTrack(const CylHead &, const Track &)");
}

Assistant:

TrackData Generate11SectorTrack(const CylHead& cylhead, const Track& track)
{
    assert(Is11SectorTrack(track));

    BitstreamTrackBuilder bitbuf(DataRate::_250K, Encoding::MFM);
    bitbuf.addTrackStart(true);

    for (auto& sector : track)
        bitbuf.addSector(sector, 1);

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}